

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_raw.c
# Opt level: O0

int archive_write_raw_header(archive_write *a,archive_entry *entry)

{
  int *piVar1;
  mode_t mVar2;
  raw *raw;
  archive_entry *entry_local;
  archive_write *a_local;
  
  piVar1 = (int *)a->format_data;
  mVar2 = archive_entry_filetype(entry);
  if (mVar2 == 0x8000) {
    if (*piVar1 < 1) {
      *piVar1 = *piVar1 + 1;
      a_local._4_4_ = 0;
    }
    else {
      archive_set_error(&a->archive,0x22,"Raw format only supports one entry per archive");
      a_local._4_4_ = -0x1e;
    }
  }
  else {
    archive_set_error(&a->archive,0x22,"Raw format only supports filetype AE_IFREG");
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_raw_header(struct archive_write *a, struct archive_entry *entry)
{
	struct raw *raw = (struct raw *)a->format_data;

	if (archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, ERANGE,
		    "Raw format only supports filetype AE_IFREG");
		return (ARCHIVE_FATAL);
	}


	if (raw->entries_written > 0) {
		archive_set_error(&a->archive, ERANGE,
		    "Raw format only supports one entry per archive");
		return (ARCHIVE_FATAL);
	}
	raw->entries_written++;

	return (ARCHIVE_OK);
}